

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_db.cpp
# Opt level: O1

bool __thiscall Fossilize::StreamArchive::prepare(StreamArchive *this)

{
  ulong uVar1;
  Impl *pIVar2;
  pointer ppEVar3;
  pointer ppEVar4;
  bool bVar5;
  int iVar6;
  LogLevel LVar7;
  uint uVar8;
  FILE *pFVar9;
  ulong uVar10;
  size_t sVar11;
  ulong uVar12;
  char *__modes;
  pointer __filename;
  ResourceTag tag;
  ulong __off;
  PayloadHeader header;
  uint8_t magic [16];
  uint64_t value;
  Entry entry;
  char bytes_to_read [56];
  PayloadHeader local_f8;
  undefined7 local_e8;
  undefined1 uStack_e1;
  undefined7 uStack_e0;
  char local_d9;
  unordered_map<unsigned_long,_Fossilize::StreamArchive::Entry,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Fossilize::StreamArchive::Entry>_>_>
  *local_d8;
  ulonglong local_d0;
  ulong local_c8;
  ulong uStack_c0;
  uint32_t local_b8;
  uint32_t uStack_b4;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined1 local_98;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined1 local_78;
  undefined1 local_68 [8];
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  undefined8 uStack_48;
  PayloadHeaderRaw local_40;
  
  pIVar2 = (this->super_DatabaseInterface).impl;
  ppEVar3 = (pIVar2->imported_metadata).
            super__Vector_base<const_Fossilize::ExportedMetadataHeader_*,_std::allocator<const_Fossilize::ExportedMetadataHeader_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  ppEVar4 = (pIVar2->imported_metadata).
            super__Vector_base<const_Fossilize::ExportedMetadataHeader_*,_std::allocator<const_Fossilize::ExportedMetadataHeader_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (8 < (ulong)((long)ppEVar3 - (long)ppEVar4) || this->mode != ReadOnly && ppEVar3 != ppEVar4)
  goto switchD_0013f594_caseD_2;
  switch(this->mode) {
  case Append:
    pFVar9 = fopen((this->path)._M_dataplus._M_p,"r+b");
    this->file = (FILE *)pFVar9;
    if (pFVar9 == (FILE *)0x0) goto switchD_0013f594_caseD_3;
    goto switchD_0013f594_default;
  case ReadOnly:
    __filename = (this->path)._M_dataplus._M_p;
    __modes = "rb";
    break;
  case AppendWithReadOnlyAccess:
    goto switchD_0013f594_caseD_2;
  case OverWrite:
switchD_0013f594_caseD_3:
    __filename = (this->path)._M_dataplus._M_p;
    __modes = "wb";
    break;
  case ExclusiveOverWrite:
    __filename = (this->path)._M_dataplus._M_p;
    __modes = "wbx";
    break;
  default:
    goto switchD_0013f594_default;
  }
  pFVar9 = fopen(__filename,__modes);
  this->file = (FILE *)pFVar9;
switchD_0013f594_default:
  pFVar9 = (FILE *)this->file;
  if (pFVar9 == (FILE *)0x0) {
switchD_0013f594_caseD_2:
    bVar5 = false;
  }
  else {
    pIVar2 = (this->super_DatabaseInterface).impl;
    ppEVar3 = (pIVar2->imported_metadata).
              super__Vector_base<const_Fossilize::ExportedMetadataHeader_*,_std::allocator<const_Fossilize::ExportedMetadataHeader_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (ppEVar3 ==
        (pIVar2->imported_metadata).
        super__Vector_base<const_Fossilize::ExportedMetadataHeader_*,_std::allocator<const_Fossilize::ExportedMetadataHeader_*>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      if (1 < this->mode - OverWrite) {
        iVar6 = fileno(pFVar9);
        iVar6 = posix_fadvise(iVar6,0,0,2);
        if (((iVar6 != 0) && (LVar7 = get_thread_log_level(), (int)LVar7 < 2)) &&
           (bVar5 = Internal::log_thread_callback
                              (LOG_DEFAULT,
                               "Failed to advise of file usage. This is not fatal, but might compromise disk performance.\n"
                              ), !bVar5)) {
          prepare();
        }
        fseek((FILE *)this->file,0,2);
        uVar10 = ftell((FILE *)this->file);
        rewind((FILE *)this->file);
        if ((uVar10 != 0) && ((shutdown_requested & 1) == 0)) {
          sVar11 = fread(&local_e8,1,0x10,(FILE *)this->file);
          if (((sVar11 == 0x10) &&
              (CONCAT71(uStack_e0,uStack_e1) == 0x4244455a49 &&
               CONCAT17(uStack_e1,local_e8) == 0x494c4953534f4681)) &&
             (0xfd < (byte)(local_d9 - 7U))) {
            if (uVar10 < 0x11) {
              uVar12 = 0x10;
              __off = uVar10;
            }
            else {
              local_d8 = this->seen_blobs;
              uVar12 = 0x10;
              do {
                __off = uVar12;
                if ((shutdown_requested & 1) != 0) {
                  uVar8 = 1;
LAB_0013f990:
                  if (uVar8 == 0) goto LAB_0013f6fb;
                  goto switchD_0013f594_caseD_2;
                }
                local_f8.payload_size = 0;
                local_f8.format = 0;
                local_f8.crc = 0;
                local_f8.uncompressed_size = 0;
                uVar1 = __off + 0x38;
                uVar12 = __off;
                if (uVar10 < uVar1) {
                  LVar7 = get_thread_log_level();
                  uVar8 = 8;
                  if (((int)LVar7 < 2) &&
                     (bVar5 = Internal::log_thread_callback
                                        (LOG_DEFAULT,
                                         "Detected sliced file. Dropping entries from here.\n"),
                     !bVar5)) {
                    prepare();
                  }
                }
                else {
                  sVar11 = fread(local_68,1,0x38,(FILE *)this->file);
                  uVar8 = 1;
                  if (sVar11 == 0x38) {
                    convert_from_le(&local_f8,&local_40);
                    if (uVar10 < (local_f8._0_8_ & 0xffffffff) + uVar1) {
                      LVar7 = get_thread_log_level();
                      uVar8 = 8;
                      uVar12 = uVar1;
                      if (((int)LVar7 < 2) &&
                         (bVar5 = Internal::log_thread_callback
                                            (LOG_DEFAULT,
                                             "Detected sliced file. Dropping entries from here.\n"),
                         !bVar5)) {
                        prepare();
                      }
                    }
                    else {
                      local_78 = 0;
                      local_88 = local_60;
                      uStack_80 = uStack_58;
                      local_98 = 0;
                      local_a8 = local_50;
                      uStack_a0 = uStack_48;
                      uVar12 = strtoul((char *)&local_88,(char **)0x0,0x10);
                      tag = (ResourceTag)uVar12;
                      if (tag < RESOURCE_COUNT) {
                        local_d0 = strtoull((char *)&local_a8,(char **)0x0,0x10);
                        uStack_c0._0_4_ = local_f8.payload_size;
                        uStack_c0._4_4_ = local_f8.format;
                        local_b8 = local_f8.crc;
                        uStack_b4 = local_f8.uncompressed_size;
                        local_c8 = uVar1;
                        bVar5 = DatabaseInterface::test_resource_filter
                                          (&this->super_DatabaseInterface,tag,local_d0);
                        if (bVar5) {
                          std::
                          _Hashtable<unsigned_long,std::pair<unsigned_long_const,Fossilize::StreamArchive::Entry>,std::allocator<std::pair<unsigned_long_const,Fossilize::StreamArchive::Entry>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                          ::_M_emplace<unsigned_long&,Fossilize::StreamArchive::Entry&>
                                    ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,Fossilize::StreamArchive::Entry>,std::allocator<std::pair<unsigned_long_const,Fossilize::StreamArchive::Entry>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                                      *)(local_d8 +
                                        (tag & (RESOURCE_APPLICATION_BLOB_LINK|
                                               RESOURCE_COMPUTE_PIPELINE))),&local_d0,&local_c8);
                        }
                      }
                      uVar8 = fseek((FILE *)this->file,local_f8._0_8_ & 0xffffffff,1);
                      uVar12 = local_f8._0_8_ & 0xffffffff;
                      if ((int)uVar8 < 0) {
                        uVar12 = 0;
                      }
                      uVar8 = uVar8 >> 0x1f;
                      uVar12 = uVar1 + uVar12;
                    }
                  }
                }
                if (uVar8 != 0) {
                  if (uVar8 != 8) goto LAB_0013f990;
                  break;
                }
              } while (uVar12 < uVar10);
            }
            if (((this->mode != Append) || (uVar12 == uVar10)) ||
               (iVar6 = fseek((FILE *)this->file,__off,0), -1 < iVar6)) goto LAB_0013f6fb;
          }
          goto switchD_0013f594_caseD_2;
        }
        pFVar9 = (FILE *)this->file;
      }
      sVar11 = fwrite(&stream_reference_magic_and_version,1,0x10,pFVar9);
      if (sVar11 != 0x10) goto switchD_0013f594_caseD_2;
    }
    else {
      this->imported_metadata = *ppEVar3;
      iVar6 = fileno(pFVar9);
      iVar6 = posix_fadvise(iVar6,0,0,1);
      if (((iVar6 != 0) && (LVar7 = get_thread_log_level(), (int)LVar7 < 2)) &&
         (bVar5 = Internal::log_thread_callback
                            (LOG_DEFAULT,
                             "Failed to advise of file usage. This is not fatal, but might compromise disk performance.\n"
                            ), !bVar5)) {
        prepare();
      }
    }
LAB_0013f6fb:
    this->alive = true;
    bVar5 = true;
  }
  return bVar5;
}

Assistant:

bool prepare() override
	{
		if (!impl->imported_metadata.empty() && mode != DatabaseMode::ReadOnly)
			return false;
		if (impl->imported_metadata.size() > 1)
			return false;

		switch (mode)
		{
		case DatabaseMode::ReadOnly:
#if _WIN32
			{
				file = nullptr;
				int fd = _open(path.c_str(), _O_BINARY | _O_RDONLY |
				               (impl->imported_metadata.empty() ? _O_SEQUENTIAL : _O_RANDOM),
				               _S_IREAD);
				if (fd >= 0)
					file = _fdopen(fd, "rb");
			}
#else
			file = fopen(path.c_str(), "rb");
#endif
			break;

		case DatabaseMode::Append:
			file = fopen(path.c_str(), "r+b");
			// r+b on empty file does not seem to work on Windows, so just fall back to wb.
			if (!file)
				file = fopen(path.c_str(), "wb");
			break;

		case DatabaseMode::AppendWithReadOnlyAccess:
			return false;

		case DatabaseMode::OverWrite:
			file = fopen(path.c_str(), "wb");
			break;

		case DatabaseMode::ExclusiveOverWrite:
		{
#ifdef _WIN32
			file = nullptr;
			int fd = _open(path.c_str(), _O_BINARY | _O_WRONLY | _O_CREAT | _O_EXCL | _O_TRUNC | _O_SEQUENTIAL, _S_IWRITE | _S_IREAD);
			if (fd >= 0)
				file = _fdopen(fd, "wb");
#else
			file = fopen(path.c_str(), "wbx");
#endif
			break;
		}
		}

		if (!file)
			return false;

		if (!impl->imported_metadata.empty())
		{
			// Do nothing here. TODO: Set fadvise to RANDOM here.
			imported_metadata = impl->imported_metadata[0];
#ifdef __linux__
			// We're going to be doing scattered reads, which hopefully have been cached earlier.
			// However, if the archive has been paged out, RANDOM is the correct approach,
			// since prefetching data is only detrimental.
			if (posix_fadvise(fileno(file), 0, 0, POSIX_FADV_RANDOM) != 0)
				LOGW_LEVEL("Failed to advise of file usage. This is not fatal, but might compromise disk performance.\n");
#endif
		}
		else if (mode != DatabaseMode::OverWrite && mode != DatabaseMode::ExclusiveOverWrite)
		{
#if _WIN32
			if (mode == DatabaseMode::ReadOnly)
			{
				// Set the buffer size to reduce I/O cost of sparse freads
				setvbuf(file, nullptr, _IOFBF, FOSSILIZE_BLOB_HASH_LENGTH + sizeof(PayloadHeaderRaw));
			}
#endif

#ifdef __linux__
			// We're going to scan through the archive sequentially to discover metadata, so some prefetching is welcome.
			if (posix_fadvise(fileno(file), 0, 0, POSIX_FADV_SEQUENTIAL) != 0)
				LOGW_LEVEL("Failed to advise of file usage. This is not fatal, but might compromise disk performance.\n");
#endif

			// Scan through the archive and get the list of files.
			fseek(file, 0, SEEK_END);
			size_t len = ftell(file);
			rewind(file);

			if (len != 0 && !shutdown_requested.load(std::memory_order_relaxed))
			{
				uint8_t magic[MagicSize];
				if (fread(magic, 1, MagicSize, file) != MagicSize)
					return false;

				if (memcmp(magic, stream_reference_magic_and_version, MagicSize - 1))
					return false;
				int version = magic[MagicSize - 1];
				if (version > FOSSILIZE_FORMAT_VERSION || version < FOSSILIZE_FORMAT_MIN_COMPAT_VERSION)
					return false;

				size_t offset = MagicSize;
				size_t begin_append_offset = len;

				while (offset < len)
				{
					if (shutdown_requested.load(std::memory_order_relaxed))
						return false;

					begin_append_offset = offset;

					PayloadHeaderRaw *header_raw = nullptr;
					char bytes_to_read[FOSSILIZE_BLOB_HASH_LENGTH + sizeof(PayloadHeaderRaw)];
					PayloadHeader header = {};

					// Corrupt entry. Our process might have been killed before we could write all data.
					if (offset + sizeof(bytes_to_read) > len)
					{
						LOGW_LEVEL("Detected sliced file. Dropping entries from here.\n");
						break;
					}

					// NAME + HEADER in one read
					if (fread(bytes_to_read, 1, sizeof(bytes_to_read), file) != sizeof(bytes_to_read))
						return false;
					offset += sizeof(bytes_to_read);
					header_raw = (PayloadHeaderRaw*)&bytes_to_read[FOSSILIZE_BLOB_HASH_LENGTH];
					convert_from_le(header, *header_raw);

					// Corrupt entry. Our process might have been killed before we could write all data.
					if (offset + header.payload_size > len)
					{
						LOGW_LEVEL("Detected sliced file. Dropping entries from here.\n");
						break;
					}

					char tag_str[16 + 1] = {};
					char value_str[16 + 1] = {};
					memcpy(tag_str, bytes_to_read + FOSSILIZE_BLOB_HASH_LENGTH - 32, 16);
					memcpy(value_str, bytes_to_read + FOSSILIZE_BLOB_HASH_LENGTH - 16, 16);

					auto tag = unsigned(strtoul(tag_str, nullptr, 16));
					if (tag < RESOURCE_COUNT)
					{
						uint64_t value = strtoull(value_str, nullptr, 16);
						Entry entry = {};
						entry.header = header;
						entry.offset = offset;
						if (test_resource_filter(static_cast<ResourceTag>(tag), value))
							seen_blobs[tag].emplace(value, entry);
					}

					if (fseek(file, header.payload_size, SEEK_CUR) < 0)
						return false;

					offset += header.payload_size;
				}

				if (mode == DatabaseMode::Append && offset != len)
				{
					if (fseek(file, begin_append_offset, SEEK_SET) < 0)
						return false;
				}
			}
			else
			{
				// Appending to a fresh file. Make sure we have the magic.
				if (fwrite(stream_reference_magic_and_version, 1,
				           sizeof(stream_reference_magic_and_version), file) != sizeof(stream_reference_magic_and_version))
					return false;
			}
		}
		else
		{
			if (fwrite(stream_reference_magic_and_version, 1, sizeof(stream_reference_magic_and_version), file) !=
			    sizeof(stream_reference_magic_and_version))
			{
				return false;
			}
		}

		alive = true;
		return true;
	}